

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall
crnlib::crn_comp::pack_blocks
          (crn_comp *this,uint group,bool clear_histograms,symbol_codec *pCodec,
          vector<unsigned_short> *pColor_endpoint_remap,
          vector<unsigned_short> *pColor_selector_remap,
          vector<unsigned_short> *pAlpha_endpoint_remap,
          vector<unsigned_short> *pAlpha_selector_remap)

{
  symbol_histogram *psVar1;
  elemental_vector *peVar2;
  uint8 uVar3;
  ushort uVar4;
  level_details *plVar5;
  endpoint_indices_details *peVar6;
  long *plVar7;
  uint *puVar8;
  void *pvVar9;
  uint8 uVar10;
  undefined1 *puVar11;
  byte bVar12;
  uint c;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  vector<unsigned_short> *pvVar17;
  ulong uVar18;
  uint uVar19;
  uint sym;
  int iVar20;
  ulong uVar21;
  byte bVar22;
  uint uVar23;
  bool bVar24;
  uint endpoint_index [3];
  vector<unsigned_short> *selector_remap [3];
  vector<unsigned_short> *endpoint_remap [3];
  uint local_90 [4];
  static_huffman_data_model *local_80;
  symbol_histogram *local_78;
  undefined1 *local_70;
  long local_68 [4];
  long local_48 [3];
  
  if (pCodec == (symbol_codec *)0x0) {
    psVar1 = &this->m_reference_hist;
    uVar15 = (this->m_reference_hist).m_hist.m_size;
    if (uVar15 != 0x100) {
      if (uVar15 < 0x101) {
        if ((this->m_reference_hist).m_hist.m_capacity < 0x100) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)psVar1,0x100,uVar15 == 0xff,4,(object_mover)0x0,false);
          uVar15 = (this->m_reference_hist).m_hist.m_size;
        }
        memset((psVar1->m_hist).m_p + uVar15,0,(ulong)(0x100 - uVar15) << 2);
      }
      (this->m_reference_hist).m_hist.m_size = 0x100;
    }
    if (clear_histograms) {
      puVar8 = (psVar1->m_hist).m_p;
      uVar18 = 0;
      do {
        puVar8[uVar18] = 0;
        uVar18 = uVar18 + 1;
      } while (uVar18 < (this->m_reference_hist).m_hist.m_size);
    }
    if (pColor_endpoint_remap != (vector<unsigned_short> *)0x0) {
      psVar1 = this->m_endpoint_index_hist;
      uVar15 = pColor_endpoint_remap->m_size;
      uVar19 = this->m_endpoint_index_hist[0].m_hist.m_size;
      if (uVar19 != uVar15) {
        if (uVar19 <= uVar15) {
          if (this->m_endpoint_index_hist[0].m_hist.m_capacity < uVar15) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)psVar1,uVar15,uVar19 + 1 == uVar15,4,(object_mover)0x0,
                       false);
            uVar19 = this->m_endpoint_index_hist[0].m_hist.m_size;
          }
          memset((psVar1->m_hist).m_p + uVar19,0,(ulong)(uVar15 - uVar19) << 2);
        }
        this->m_endpoint_index_hist[0].m_hist.m_size = uVar15;
      }
      if (clear_histograms && uVar15 != 0) {
        puVar8 = (psVar1->m_hist).m_p;
        uVar18 = 0;
        do {
          puVar8[uVar18] = 0;
          uVar18 = uVar18 + 1;
        } while (uVar18 < this->m_endpoint_index_hist[0].m_hist.m_size);
      }
    }
    if (pColor_selector_remap != (vector<unsigned_short> *)0x0) {
      psVar1 = this->m_selector_index_hist;
      uVar15 = pColor_selector_remap->m_size;
      uVar19 = this->m_selector_index_hist[0].m_hist.m_size;
      if (uVar19 != uVar15) {
        if (uVar19 <= uVar15) {
          if (this->m_selector_index_hist[0].m_hist.m_capacity < uVar15) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)psVar1,uVar15,uVar19 + 1 == uVar15,4,(object_mover)0x0,
                       false);
            uVar19 = this->m_selector_index_hist[0].m_hist.m_size;
          }
          memset((psVar1->m_hist).m_p + uVar19,0,(ulong)(uVar15 - uVar19) << 2);
        }
        this->m_selector_index_hist[0].m_hist.m_size = uVar15;
      }
      if (clear_histograms && uVar15 != 0) {
        puVar8 = (psVar1->m_hist).m_p;
        uVar18 = 0;
        do {
          puVar8[uVar18] = 0;
          uVar18 = uVar18 + 1;
        } while (uVar18 < this->m_selector_index_hist[0].m_hist.m_size);
      }
    }
    if (pAlpha_endpoint_remap != (vector<unsigned_short> *)0x0) {
      peVar2 = (elemental_vector *)(this->m_endpoint_index_hist + 1);
      uVar15 = pAlpha_endpoint_remap->m_size;
      uVar19 = this->m_endpoint_index_hist[1].m_hist.m_size;
      if (uVar19 != uVar15) {
        if (uVar19 <= uVar15) {
          if (this->m_endpoint_index_hist[1].m_hist.m_capacity < uVar15) {
            elemental_vector::increase_capacity
                      (peVar2,uVar15,uVar19 + 1 == uVar15,4,(object_mover)0x0,false);
            uVar19 = this->m_endpoint_index_hist[1].m_hist.m_size;
          }
          memset((void *)((ulong)uVar19 * 4 + (long)peVar2->m_p),0,(ulong)(uVar15 - uVar19) << 2);
        }
        this->m_endpoint_index_hist[1].m_hist.m_size = uVar15;
      }
      if (clear_histograms && uVar15 != 0) {
        pvVar9 = peVar2->m_p;
        uVar18 = 0;
        do {
          *(undefined4 *)((long)pvVar9 + uVar18 * 4) = 0;
          uVar18 = uVar18 + 1;
        } while (uVar18 < this->m_endpoint_index_hist[1].m_hist.m_size);
      }
    }
    if (pAlpha_selector_remap != (vector<unsigned_short> *)0x0) {
      peVar2 = (elemental_vector *)(this->m_selector_index_hist + 1);
      uVar15 = pAlpha_selector_remap->m_size;
      uVar19 = this->m_selector_index_hist[1].m_hist.m_size;
      if (uVar19 != uVar15) {
        if (uVar19 <= uVar15) {
          if (this->m_selector_index_hist[1].m_hist.m_capacity < uVar15) {
            elemental_vector::increase_capacity
                      (peVar2,uVar15,uVar19 + 1 == uVar15,4,(object_mover)0x0,false);
            uVar19 = this->m_selector_index_hist[1].m_hist.m_size;
          }
          memset((void *)((ulong)uVar19 * 4 + (long)peVar2->m_p),0,(ulong)(uVar15 - uVar19) << 2);
        }
        this->m_selector_index_hist[1].m_hist.m_size = uVar15;
      }
      if (clear_histograms && uVar15 != 0) {
        pvVar9 = peVar2->m_p;
        uVar18 = 0;
        do {
          *(undefined4 *)((long)pvVar9 + uVar18 * 4) = 0;
          uVar18 = uVar18 + 1;
        } while (uVar18 < this->m_selector_index_hist[1].m_hist.m_size);
      }
    }
  }
  lVar16 = 0;
  local_90[0] = 0;
  local_90[1] = 0;
  local_90[2] = 0;
  local_48[2] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_68[2] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  do {
    if (this->m_has_comp[lVar16] == true) {
      pvVar17 = pAlpha_endpoint_remap;
      if (lVar16 == 0) {
        pvVar17 = pColor_endpoint_remap;
      }
      local_68[lVar16 + 4] = (long)pvVar17;
      pvVar17 = pAlpha_selector_remap;
      if (lVar16 == 0) {
        pvVar17 = pColor_selector_remap;
      }
      local_68[lVar16] = (long)pvVar17;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  plVar5 = (this->m_levels).m_p;
  uVar15 = plVar5[group].first_block;
  uVar18 = (ulong)uVar15;
  uVar19 = plVar5[group].num_blocks + uVar15;
  if (uVar15 < uVar19) {
    uVar15 = plVar5[group].block_width;
    local_80 = &this->m_reference_dm;
    uVar14 = 0;
    local_70 = &this->field_0x1fc0;
    local_78 = this->m_selector_index_hist;
    do {
      if (uVar15 != 0) {
        uVar13 = 0;
        do {
          bVar22 = this->m_has_subblocks & (byte)uVar13;
          iVar20 = (int)uVar18;
          if (((uVar13 | uVar14) & 1) == 0) {
            peVar6 = (this->m_endpoint_indices).m_p;
            bVar12 = peVar6[uVar15 + iVar20 + 1].reference << 6 | peVar6[iVar20 + 1].reference << 4
                     | peVar6[iVar20 + uVar15].reference << 2 | peVar6[uVar18].reference;
            if (pCodec == (symbol_codec *)0x0) {
              puVar8 = (this->m_reference_hist).m_hist.m_p + bVar12;
              *puVar8 = *puVar8 + 1;
            }
            else {
              symbol_codec::encode(pCodec,(uint)bVar12,local_80);
            }
          }
          uVar21 = 0;
          do {
            plVar7 = (long *)local_68[uVar21 + 4];
            if (plVar7 != (long *)0x0) {
              peVar6 = (this->m_endpoint_indices).m_p;
              uVar23 = (uint)*(ushort *)
                              (*plVar7 + (ulong)peVar6[uVar18].field_0.component[uVar21] * 2);
              uVar3 = peVar6[uVar18].reference;
              uVar10 = uVar3 == '\0';
              if (bVar22 != 0) {
                uVar10 = uVar3;
              }
              if (uVar10 != '\0') {
                sym = uVar23 - local_90[uVar21];
                if ((int)sym < 0) {
                  sym = sym + (int)plVar7[1];
                }
                if (pCodec == (symbol_codec *)0x0) {
                  puVar8 = this->m_endpoint_index_hist[uVar21 != 0].m_hist.m_p + sym;
                  *puVar8 = *puVar8 + 1;
                }
                else {
                  symbol_codec::encode
                            (pCodec,sym,
                             (static_huffman_data_model *)
                             ((long)this->m_endpoint_index_hist + (ulong)(uVar21 != 0) * 0x38 + 0x20
                             ));
                }
              }
              local_90[uVar21] = uVar23;
            }
            puVar11 = local_70;
            psVar1 = local_78;
            bVar24 = uVar21 < 2;
            uVar21 = uVar21 + 1;
          } while (bVar24 && bVar22 == 0);
          if (bVar22 == 0) {
            uVar21 = 0xffffffffffffffff;
            do {
              if ((long *)local_68[uVar21 + 1] != (long *)0x0) {
                uVar4 = *(ushort *)
                         (*(long *)local_68[uVar21 + 1] +
                         (ulong)*(ushort *)
                                 ((long)&(this->m_selector_indices).m_p[uVar18].field_0 +
                                 uVar21 * 2 + 2) * 2);
                if (pCodec == (symbol_codec *)0x0) {
                  puVar8 = psVar1[uVar21 != 0xffffffffffffffff].m_hist.m_p + uVar4;
                  *puVar8 = *puVar8 + 1;
                }
                else {
                  symbol_codec::encode
                            (pCodec,(uint)uVar4,
                             (static_huffman_data_model *)
                             (puVar11 + (ulong)(uVar21 != 0xffffffffffffffff) * 0x38));
                }
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < 2);
          }
          uVar13 = uVar13 + 1;
          uVar18 = (ulong)(iVar20 + 1);
        } while (uVar13 != uVar15);
      }
      uVar14 = uVar14 + 1;
    } while ((uint)uVar18 < uVar19);
  }
  return true;
}

Assistant:

bool crn_comp::pack_blocks(
        uint group,
        bool clear_histograms,
        symbol_codec* pCodec,
        const crnlib::vector<uint16>* pColor_endpoint_remap,
        const crnlib::vector<uint16>* pColor_selector_remap,
        const crnlib::vector<uint16>* pAlpha_endpoint_remap,
        const crnlib::vector<uint16>* pAlpha_selector_remap)
    {
        if (!pCodec)
        {
            m_reference_hist.resize(256);
            if (clear_histograms)
            {
                m_reference_hist.set_all(0);
            }

            if (pColor_endpoint_remap)
            {
                m_endpoint_index_hist[0].resize(pColor_endpoint_remap->size());
                if (clear_histograms)
                {
                    m_endpoint_index_hist[0].set_all(0);
                }
            }

            if (pColor_selector_remap)
            {
                m_selector_index_hist[0].resize(pColor_selector_remap->size());
                if (clear_histograms)
                {
                    m_selector_index_hist[0].set_all(0);
                }
            }

            if (pAlpha_endpoint_remap)
            {
                m_endpoint_index_hist[1].resize(pAlpha_endpoint_remap->size());
                if (clear_histograms)
                {
                    m_endpoint_index_hist[1].set_all(0);
                }
            }

            if (pAlpha_selector_remap)
            {
                m_selector_index_hist[1].resize(pAlpha_selector_remap->size());
                if (clear_histograms)
                {
                    m_selector_index_hist[1].set_all(0);
                }
            }
        }

        uint endpoint_index[cNumComps] = {};
        const crnlib::vector<uint16>* endpoint_remap[cNumComps] = {};
        const crnlib::vector<uint16>* selector_remap[cNumComps] = {};
        for (uint c = 0; c < cNumComps; c++)
        {
            if (m_has_comp[c])
            {
                endpoint_remap[c] = c ? pAlpha_endpoint_remap : pColor_endpoint_remap;
                selector_remap[c] = c ? pAlpha_selector_remap : pColor_selector_remap;
            }
        }

        uint block_width = m_levels[group].block_width;
        for (uint by = 0, b = m_levels[group].first_block, bEnd = b + m_levels[group].num_blocks; b < bEnd; by++)
        {
            for (uint bx = 0; bx < block_width; bx++, b++)
            {
                const bool secondary_etc_subblock = m_has_subblocks && bx & 1;
                if (!(by & 1) && !(bx & 1))
                {
                    uint8 reference_group = m_endpoint_indices[b].reference | m_endpoint_indices[b + block_width].reference << 2 |
                        m_endpoint_indices[b + 1].reference << 4 | m_endpoint_indices[b + block_width + 1].reference << 6;
                    if (pCodec)
                    {
                        pCodec->encode(reference_group, m_reference_dm);
                    }
                    else
                    {
                        m_reference_hist.inc_freq(reference_group);
                    }
                }
                for (uint c = 0, cEnd = secondary_etc_subblock ? cAlpha0 : cNumComps; c < cEnd; c++)
                {
                    if (endpoint_remap[c])
                    {
                        uint index = (*endpoint_remap[c])[m_endpoint_indices[b].component[c]];
                        if (secondary_etc_subblock ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference)
                        {
                            int sym = index - endpoint_index[c];
                            if (sym < 0)
                            {
                                sym += endpoint_remap[c]->size();
                            }
                            if (!pCodec)
                            {
                                m_endpoint_index_hist[c ? 1 : 0].inc_freq(sym);
                            }
                            else
                            {
                                pCodec->encode(sym, m_endpoint_index_dm[c ? 1 : 0]);
                            }
                        }
                        endpoint_index[c] = index;
                    }
                }
                for (uint c = 0, cEnd = secondary_etc_subblock ? 0 : cNumComps; c < cEnd; c++)
                {
                    if (selector_remap[c])
                    {
                        uint index = (*selector_remap[c])[m_selector_indices[b].component[c]];
                        if (!pCodec)
                        {
                            m_selector_index_hist[c ? 1 : 0].inc_freq(index);
                        }
                        else
                        {
                            pCodec->encode(index, m_selector_index_dm[c ? 1 : 0]);
                        }
                    }
                }
            }
        }
        return true;
    }